

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O2

void __thiscall ftxui::anon_unknown_0::Text::~Text(Text *this)

{
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__Text_0011eb50;
  std::__cxx11::string::~string((string *)&this->text_);
  Node::~Node(&this->super_Node);
  return;
}

Assistant:

explicit Text(std::string text) : text_(std::move(text)) {}